

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O0

void ncnn::convdw3x3s1_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_requant,Option *opt)

{
  reference pvVar1;
  Mat *in_RCX;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  Mat *in_R8;
  double dVar2;
  int sum;
  int remain;
  int i;
  char *r2;
  char *r1;
  char *r0;
  char *img0;
  char *kernel0;
  float scale_requant_out;
  float scale_requant_in;
  float bias0;
  char *outptr;
  Mat out;
  int p;
  float *bias;
  char *kernel;
  int outch;
  int outh;
  int outw;
  int w;
  int int32;
  float local_16c;
  char *in_stack_fffffffffffffea0;
  int local_148;
  int local_144;
  char *local_140;
  char *local_138;
  char *local_130;
  Mat local_128;
  char *local_e0;
  char *local_d8;
  value_type local_d0;
  value_type local_cc;
  float local_c8;
  char *local_b8;
  Mat local_b0;
  int local_64;
  float *local_60;
  char *local_58;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  Mat *local_30;
  int local_c;
  float local_8;
  char local_1;
  
  local_44 = *(int *)(in_RDI + 0x2c);
  local_48 = *(int *)(in_RSI + 0x2c);
  local_4c = *(int *)(in_RSI + 0x30);
  local_50 = *(int *)(in_RSI + 0x38);
  local_30 = in_RCX;
  local_58 = Mat::operator_cast_to_signed_char_(in_RDX);
  local_60 = Mat::operator_cast_to_float_(local_30);
  for (local_64 = 0; local_64 < local_50; local_64 = local_64 + 1) {
    Mat::channel(in_R8,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
    in_stack_fffffffffffffea0 = Mat::operator_cast_to_signed_char_(&local_b0);
    if (local_60 == (float *)0x0) {
      local_16c = 0.0;
    }
    else {
      local_16c = local_60[local_64];
    }
    local_c8 = local_16c;
    local_b8 = in_stack_fffffffffffffea0;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)in_R8,(long)(local_64 * 2));
    local_cc = *pvVar1;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)in_R8,(long)(local_64 * 2 + 1));
    local_d0 = *pvVar1;
    local_d8 = local_58 + local_64 * 9;
    Mat::channel(in_R8,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
    local_130 = Mat::operator_cast_to_signed_char_(&local_128);
    Mat::~Mat((Mat *)0x65c3e1);
    local_138 = local_130 + local_44;
    local_140 = local_130 + (local_44 << 1);
    local_e0 = local_130;
    for (local_144 = 0; local_144 < local_4c; local_144 = local_144 + 1) {
      for (local_148 = local_48; 0 < local_148; local_148 = local_148 + -1) {
        local_8 = ((float)((int)local_140[2] * (int)local_d8[8] +
                          (int)local_140[1] * (int)local_d8[7] +
                          (int)*local_140 * (int)local_d8[6] +
                          (int)local_138[2] * (int)local_d8[5] +
                          (int)local_138[1] * (int)local_d8[4] +
                          (int)*local_138 * (int)local_d8[3] +
                          (int)local_130[2] * (int)local_d8[2] +
                          (int)local_130[1] * (int)local_d8[1] + (int)*local_130 * (int)*local_d8) *
                   local_cc + local_c8) * local_d0;
        dVar2 = std::round((double)(ulong)(uint)local_8);
        local_c = (int)SUB84(dVar2,0);
        if (local_c < 0x80) {
          if (local_c < -0x7f) {
            local_1 = -0x7f;
          }
          else {
            local_1 = (char)local_c;
          }
        }
        else {
          local_1 = '\x7f';
        }
        *local_b8 = local_1;
        local_130 = local_130 + 1;
        local_138 = local_138 + 1;
        local_140 = local_140 + 1;
        local_b8 = local_b8 + 1;
      }
      local_130 = local_130 + 2;
      local_138 = local_138 + 2;
      local_140 = local_140 + 2;
    }
    Mat::~Mat((Mat *)0x65c6df);
  }
  return;
}

Assistant:

static void convdw3x3s1_int8_requant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, std::vector<float> scales_requant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        signed char* outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_requant_in = scales_requant[2 * p];
        const float scale_requant_out = scales_requant[2 * p + 1];

        const signed char* kernel0 = (const signed char*)kernel + p * 9;

        const signed char* img0 = bottom_blob.channel(p);
        const signed char* r0 = img0;
        const signed char* r1 = img0 + w;
        const signed char* r2 = img0 + w * 2;

        int i = 0;
        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr = float2int8(((float)sum * scale_requant_in + bias0) * scale_requant_out);

                r0++;
                r1++;
                r2++;
                outptr++;
            }

            r0 += 2;
            r1 += 2;
            r2 += 2;
        }
    }
}